

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

bool __thiscall
booster::locale::gnu_gettext::message_key<char>::operator<
          (message_key<char> *this,message_key<char> *other)

{
  int iVar1;
  char_type *pcVar2;
  char_type *pcVar3;
  
  pcVar3 = this->c_context_;
  if (pcVar3 == (char_type *)0x0) {
    pcVar3 = (this->context_)._M_dataplus._M_p;
  }
  pcVar2 = other->c_context_;
  if (pcVar2 == (char_type *)0x0) {
    pcVar2 = (other->context_)._M_dataplus._M_p;
  }
  iVar1 = compare(pcVar3,pcVar2);
  if (iVar1 == 0) {
    pcVar3 = this->c_key_;
    if (pcVar3 == (char_type *)0x0) {
      pcVar3 = (this->key_)._M_dataplus._M_p;
    }
    pcVar2 = other->c_key_;
    if (pcVar2 == (char_type *)0x0) {
      pcVar2 = (other->key_)._M_dataplus._M_p;
    }
    iVar1 = compare(pcVar3,pcVar2);
  }
  return SUB41((uint)iVar1 >> 0x1f,0);
}

Assistant:

bool operator < (message_key const &other) const
                {
                    int cc = compare(context(),other.context());
                    if(cc != 0)
                        return cc < 0;
                    return compare(key(),other.key()) < 0;
                }